

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_authorize_digest(mg_connection *c,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char local_4738 [48];
  char ha2 [33];
  char nc [100];
  char qop [100];
  char resp [100];
  char cnonce [100];
  char nonce [100];
  char user [100];
  char ha1 [256];
  char f_domain [256];
  char f_user [256];
  char line [256];
  char uri [16384];
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (((((fp != (FILE *)0x0 && c != (mg_connection *)0x0) &&
        (pcVar2 = mg_get_header(c,"Authorization"), pcVar2 != (char *)0x0)) &&
       (iVar1 = mg_strncasecmp(pcVar2,"Digest ",7), iVar1 == 0)) &&
      ((((iVar1 = mg_parse_header(pcVar2,"username",user,100), uVar3 = uVar4, iVar1 != 0 &&
         (iVar1 = mg_parse_header(pcVar2,"cnonce",cnonce,100), iVar1 != 0)) &&
        ((iVar1 = mg_parse_header(pcVar2,"response",resp,100), iVar1 != 0 &&
         ((iVar1 = mg_parse_header(pcVar2,"uri",uri,0x4000), iVar1 != 0 &&
          (iVar1 = mg_parse_header(pcVar2,"qop",qop,100), iVar1 != 0)))))) &&
       (iVar1 = mg_parse_header(pcVar2,"nc",nc,100), iVar1 != 0)))) &&
     (iVar1 = mg_parse_header(pcVar2,"nonce",nonce,100), iVar1 != 0)) {
    do {
      pcVar2 = fgets(line,0x100,(FILE *)fp);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
      iVar1 = __isoc99_sscanf(line,"%[^:]:%[^:]:%s",f_user,f_domain,ha1);
    } while (((iVar1 != 3) || (iVar1 = strcmp(user,f_user), iVar1 != 0)) ||
            (iVar1 = strcmp(*(char **)(c[1].request_method + 0x48),f_domain), iVar1 != 0));
    mg_md5(ha2,c->request_method,":",uri,0);
    mg_md5(local_4738,ha1,":",nonce,":",nc,":",cnonce,":",qop,":",ha2,0);
    iVar1 = mg_strcasecmp(resp,local_4738);
    uVar3 = (uint)(iVar1 == 0);
  }
  return uVar3;
}

Assistant:

int mg_authorize_digest(struct mg_connection *c, FILE *fp) {
  struct connection *conn = MG_CONN_2_CONN(c);
  const char *hdr;
  char line[256], f_user[256], ha1[256], f_domain[256], user[100], nonce[100],
       uri[MAX_REQUEST_SIZE], cnonce[100], resp[100], qop[100], nc[100];

  if (c == NULL || fp == NULL) return 0;
  if ((hdr = mg_get_header(c, "Authorization")) == NULL ||
      mg_strncasecmp(hdr, "Digest ", 7) != 0) return 0;
  if (!mg_parse_header(hdr, "username", user, sizeof(user))) return 0;
  if (!mg_parse_header(hdr, "cnonce", cnonce, sizeof(cnonce))) return 0;
  if (!mg_parse_header(hdr, "response", resp, sizeof(resp))) return 0;
  if (!mg_parse_header(hdr, "uri", uri, sizeof(uri))) return 0;
  if (!mg_parse_header(hdr, "qop", qop, sizeof(qop))) return 0;
  if (!mg_parse_header(hdr, "nc", nc, sizeof(nc))) return 0;
  if (!mg_parse_header(hdr, "nonce", nonce, sizeof(nonce))) return 0;

  while (fgets(line, sizeof(line), fp) != NULL) {
    if (sscanf(line, "%[^:]:%[^:]:%s", f_user, f_domain, ha1) == 3 &&
        !strcmp(user, f_user) &&
        // NOTE(lsm): due to a bug in MSIE, we do not compare URIs
        !strcmp(conn->server->config_options[AUTH_DOMAIN], f_domain))
      return check_password(c->request_method, ha1, uri,
                            nonce, nc, cnonce, qop, resp);
  }
  return MG_FALSE;
}